

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
NLStringRefTest_ConstructFromStdString_Test::TestBody
          (NLStringRefTest_ConstructFromStdString_Test *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  char *pcVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  string str;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"foo",(allocator<char> *)&gtest_ar);
  sVar2 = str._M_string_length;
  _Var1 = str._M_dataplus;
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_50.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,char>
            ((internal *)&gtest_ar,"0","s.c_str()[str.size()]",(int *)&local_50,
             str._M_dataplus._M_p + str._M_string_length);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       str._M_dataplus._M_p;
  local_48.data_ = (AssertHelperData *)_Var1._M_p;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)&gtest_ar,"str.c_str()","s.c_str()",(char **)&local_50,(char **)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x5c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       str._M_string_length;
  local_48.data_ = (AssertHelperData *)sVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"str.size()","s.size()",(unsigned_long *)&local_50,
             (unsigned_long *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

TEST(NLStringRefTest, ConstructFromStdString) {
  std::string str = "foo";
  const mp::NLStringRef s(str);
  EXPECT_EQ(0, s.c_str()[str.size()]);
  EXPECT_EQ(str.c_str(), s.c_str());
  EXPECT_EQ(str.size(), s.size());
}